

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha224.c
# Opt level: O2

void SHA224_256Finalize(SHA256Context *context,uint8_t Pad_Byte)

{
  uint uVar1;
  uint uVar2;
  short sVar3;
  long lVar4;
  
  lVar4 = (long)context->Message_Block_Index;
  sVar3 = context->Message_Block_Index + 1;
  context->Message_Block_Index = sVar3;
  if (lVar4 < 0x38) {
    context->Message_Block[lVar4] = Pad_Byte;
  }
  else {
    context->Message_Block[lVar4] = Pad_Byte;
    while (sVar3 < 0x40) {
      context->Message_Block_Index = sVar3 + 1;
      context->Message_Block[sVar3] = '\0';
      sVar3 = context->Message_Block_Index;
    }
    SHA224_256ProcessMessageBlock(context);
  }
  while( true ) {
    sVar3 = context->Message_Block_Index;
    if (0x37 < (long)sVar3) break;
    context->Message_Block_Index = sVar3 + 1;
    context->Message_Block[sVar3] = '\0';
  }
  uVar1 = context->Length_Low;
  uVar2 = context->Length_High;
  *(uint *)(context->Message_Block + 0x38) =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  *(uint *)(context->Message_Block + 0x3c) =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  SHA224_256ProcessMessageBlock(context);
  for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
    context->Message_Block[lVar4] = '\0';
  }
  context->Length_Low = 0;
  context->Length_High = 0;
  context->Computed = 1;
  return;
}

Assistant:

static void SHA224_256Finalize(SHA256Context *context, uint8_t Pad_Byte)
{
    int i;
    SHA224_256PadMessage(context, Pad_Byte);
    /* message may be sensitive, so clear it out */
    for (i = 0; i < SHA256_Message_Block_Size; ++i)
    {
        context->Message_Block[i] = 0;
    }
    context->Length_Low = 0;  /* and clear length */
    context->Length_High = 0;
    context->Computed = 1;
}